

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O2

Bool prvTidySwitchInline(TidyDocImpl *doc,Node *element,Node *node)

{
  Lexer *pLVar1;
  Dict *pDVar2;
  Dict *pDVar3;
  IStack *pIVar4;
  tmbstr ptVar5;
  AttVal *pAVar6;
  IStack *pIVar7;
  AttVal *pAVar8;
  Bool BVar9;
  IStack *istack1;
  IStack *pIVar10;
  IStack *pIVar11;
  uint uVar12;
  uint uVar13;
  IStack tmp_istack;
  
  pLVar1 = doc->lexer;
  if ((((element != (Node *)0x0 && pLVar1 != (Lexer *)0x0) &&
       (pDVar2 = element->tag, node != (Node *)0x0 && pDVar2 != (Dict *)0x0)) &&
      (pDVar3 = node->tag, pDVar3 != (Dict *)0x0)) &&
     (((BVar9 = prvTidyIsPushed(doc,element), BVar9 != no &&
       (BVar9 = prvTidyIsPushed(doc,node), BVar9 != no)) &&
      (uVar12 = pLVar1->istacksize - pLVar1->istackbase, 1 < uVar12)))) {
    while (uVar13 = uVar12, uVar12 = uVar13 - 1, -1 < (int)uVar12) {
      pIVar11 = pLVar1->istack;
      if (pIVar11[uVar12].tag == pDVar2) {
        pIVar10 = pIVar11 + uVar12;
        uVar12 = uVar13 - 2;
        while (uVar13 = uVar12, -1 < (int)uVar13) {
          uVar12 = uVar13 - 1;
          if (pIVar11[uVar13].tag == pDVar3) {
            pIVar11 = pIVar11 + uVar13;
            pIVar4 = pIVar11->next;
            pDVar2 = pIVar11->tag;
            ptVar5 = pIVar11->element;
            pAVar6 = pIVar11->attributes;
            pIVar7 = pIVar10->next;
            pDVar3 = pIVar10->tag;
            pAVar8 = pIVar10->attributes;
            pIVar11->element = pIVar10->element;
            pIVar11->attributes = pAVar8;
            pIVar11->next = pIVar7;
            pIVar11->tag = pDVar3;
            pIVar10->element = ptVar5;
            pIVar10->attributes = pAVar6;
            pIVar10->next = pIVar4;
            pIVar10->tag = pDVar2;
            return yes;
          }
        }
        uVar12 = 0xffffffff;
      }
    }
  }
  return no;
}

Assistant:

Bool TY_(SwitchInline)( TidyDocImpl* doc, Node* element, Node* node )
{
    Lexer* lexer = doc->lexer;
    if ( lexer
         && element && element->tag
         && node && node->tag
         && TY_(IsPushed)( doc, element )
         && TY_(IsPushed)( doc, node ) 
         && ((lexer->istacksize - lexer->istackbase) >= 2) )
    {
        /* we have a chance of succeeding ... */
        int i;
        for (i = (lexer->istacksize - lexer->istackbase - 1); i >= 0; --i)
        {
            if (lexer->istack[i].tag == element->tag) {
                /* found the element tag - phew */
                IStack *istack1 = &lexer->istack[i];
                IStack *istack2 = NULL;
                --i; /* back one more, and continue */
                for ( ; i >= 0; --i)
                {
                    if (lexer->istack[i].tag == node->tag)
                    {
                        /* found the element tag - phew */
                        istack2 = &lexer->istack[i];
                        break;
                    }
                }
                if ( istack2 )
                {
                    /* perform the swap */
                    IStack tmp_istack = *istack2;
                    *istack2 = *istack1;
                    *istack1 = tmp_istack;
                    return yes;
                }
            }
        }
    }
    return no;
}